

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemv.c
# Opt level: O2

void update_mv_component_stats(int comp,nmv_component *mvcomp,MvSubpelPrecision precision)

{
  byte val;
  aom_cdf_prob *cdf;
  ulong uVar1;
  int iVar2;
  aom_cdf_prob (*cdf_00) [5];
  uint uVar3;
  aom_cdf_prob (*cdf_01) [3];
  int offset;
  
  iVar2 = -comp;
  if (0 < comp) {
    iVar2 = comp;
  }
  val = av1_get_mv_class(iVar2 + -1,&offset);
  uVar3 = offset >> 3;
  update_cdf(mvcomp->sign_cdf,(byte)((uint)comp >> 0x1f),2);
  update_cdf(mvcomp->classes_cdf,val,0xb);
  if (val == 0) {
    update_cdf(mvcomp->class0_cdf,(int8_t)uVar3,2);
  }
  else {
    cdf_01 = mvcomp->bits_cdf;
    for (uVar1 = 0; val != uVar1; uVar1 = uVar1 + 1) {
      update_cdf(*cdf_01,(uVar3 >> ((uint)uVar1 & 0x1f) & 1) != 0,2);
      cdf_01 = cdf_01 + 1;
    }
  }
  if (-1 < precision) {
    cdf_00 = mvcomp->class0_fp_cdf + (int)uVar3;
    if (val != 0) {
      cdf_00 = &mvcomp->fp_cdf;
    }
    update_cdf(*cdf_00,(byte)offset >> 1 & 3,4);
    if (precision != '\0') {
      cdf = mvcomp->class0_hp_cdf;
      if (val != 0) {
        cdf = mvcomp->hp_cdf;
      }
      update_cdf(cdf,(byte)offset & 1,2);
    }
  }
  return;
}

Assistant:

static void update_mv_component_stats(int comp, nmv_component *mvcomp,
                                      MvSubpelPrecision precision) {
  assert(comp != 0);
  int offset;
  const int sign = comp < 0;
  const int mag = sign ? -comp : comp;
  const int mv_class = av1_get_mv_class(mag - 1, &offset);
  const int d = offset >> 3;         // int mv data
  const int fr = (offset >> 1) & 3;  // fractional mv data
  const int hp = offset & 1;         // high precision mv data

  // Sign
  update_cdf(mvcomp->sign_cdf, sign, 2);

  // Class
  update_cdf(mvcomp->classes_cdf, mv_class, MV_CLASSES);

  // Integer bits
  if (mv_class == MV_CLASS_0) {
    update_cdf(mvcomp->class0_cdf, d, CLASS0_SIZE);
  } else {
    const int n = mv_class + CLASS0_BITS - 1;  // number of bits
    for (int i = 0; i < n; ++i)
      update_cdf(mvcomp->bits_cdf[i], (d >> i) & 1, 2);
  }
  // Fractional bits
  if (precision > MV_SUBPEL_NONE) {
    aom_cdf_prob *fp_cdf =
        mv_class == MV_CLASS_0 ? mvcomp->class0_fp_cdf[d] : mvcomp->fp_cdf;
    update_cdf(fp_cdf, fr, MV_FP_SIZE);
  }

  // High precision bit
  if (precision > MV_SUBPEL_LOW_PRECISION) {
    aom_cdf_prob *hp_cdf =
        mv_class == MV_CLASS_0 ? mvcomp->class0_hp_cdf : mvcomp->hp_cdf;
    update_cdf(hp_cdf, hp, 2);
  }
}